

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void number_suite::value_uint16(void)

{
  bool bVar1;
  unsigned_short uVar2;
  value vVar3;
  uint uVar4;
  size_type sVar5;
  reader reader;
  value_type input [9];
  ulong local_c0;
  unsigned_long local_b8 [4];
  reader local_98;
  uchar local_20 [16];
  
  local_20[0] = 0xb2;
  local_20[1] = 0xff;
  local_20[2] = '\x7f';
  local_20[3] = 0xb2;
  local_20[4] = '\0';
  local_20[5] = 0x80;
  local_20[6] = 0xb2;
  local_20[7] = 0xff;
  local_20[8] = 0xff;
  trial::protocol::bintoken::reader::reader<unsigned_char[9]>(&local_98,(uchar (*) [9])local_20);
  local_c0._0_4_ = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a1,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_b8[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_c0._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a2,"void number_suite::value_uint16()",local_b8,&local_c0);
  vVar3 = trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_b8[0]._0_4_ = 0;
  if (vVar3 - null < 0xc) {
    local_b8[0]._0_4_ = *(value *)(&DAT_0011edac + (ulong)(vVar3 - null) * 4);
  }
  local_c0 = CONCAT44(local_c0._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a3,"void number_suite::value_uint16()",local_b8,&local_c0);
  sVar5 = trial::protocol::bintoken::reader::length(&local_98);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a4,"void number_suite::value_uint16()",sVar5 == 1);
  trial::protocol::bintoken::reader::overloader<unsigned_char,_void>::convert(&local_98);
  boost::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a6,"void number_suite::value_uint16()");
  uVar2 = trial::protocol::bintoken::reader::overloader<unsigned_short,_void>::convert(&local_98);
  local_c0 = CONCAT62(local_c0._2_6_,uVar2);
  local_b8[0]._0_4_ = 0x7fff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0x7FFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a7,"void number_suite::value_uint16()",&local_c0,local_b8);
  uVar4 = trial::protocol::bintoken::reader::overloader<unsigned_int,_void>::convert(&local_98);
  local_b8[0] = CONCAT44(local_b8[0]._4_4_,uVar4);
  local_c0 = CONCAT44(local_c0._4_4_,0x7fff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x00007FFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a8,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_b8[0] = trial::protocol::bintoken::reader::overloader<unsigned_long,_void>::convert
                          (&local_98);
  local_c0 = 0x7fff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("reader.value<std::uint64_t>()","UINT64_C(0x0000000000007FFF)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a9,"void number_suite::value_uint16()",local_b8,&local_c0);
  bVar1 = trial::protocol::bintoken::reader::next(&local_98);
  local_b8[0] = CONCAT71(local_b8[0]._1_7_,bVar1);
  local_c0 = CONCAT71(local_c0._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1aa,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_c0._0_4_ = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ab,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_b8[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_c0._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ac,"void number_suite::value_uint16()",local_b8,&local_c0);
  vVar3 = trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_b8[0]._0_4_ = 0;
  if (vVar3 - null < 0xc) {
    local_b8[0]._0_4_ = *(value *)(&DAT_0011edac + (ulong)(vVar3 - null) * 4);
  }
  local_c0 = CONCAT44(local_c0._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ad,"void number_suite::value_uint16()",local_b8,&local_c0);
  trial::protocol::bintoken::reader::overloader<unsigned_char,_void>::convert(&local_98);
  boost::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1af,"void number_suite::value_uint16()");
  uVar2 = trial::protocol::bintoken::reader::overloader<unsigned_short,_void>::convert(&local_98);
  local_c0 = CONCAT62(local_c0._2_6_,uVar2);
  local_b8[0]._0_4_ = 0x8000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0x8000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b0,"void number_suite::value_uint16()",&local_c0,local_b8);
  uVar4 = trial::protocol::bintoken::reader::overloader<unsigned_int,_void>::convert(&local_98);
  local_b8[0] = CONCAT44(local_b8[0]._4_4_,uVar4);
  local_c0 = CONCAT44(local_c0._4_4_,0x8000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x00008000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b1,"void number_suite::value_uint16()",local_b8,&local_c0);
  bVar1 = trial::protocol::bintoken::reader::next(&local_98);
  local_b8[0] = CONCAT71(local_b8[0]._1_7_,bVar1);
  local_c0 = CONCAT71(local_c0._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b2,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_c0._0_4_ = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b3,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_b8[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_c0._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b4,"void number_suite::value_uint16()",local_b8,&local_c0);
  vVar3 = trial::protocol::bintoken::token::symbol::convert(local_98.decoder.current.code);
  local_b8[0]._0_4_ = 0;
  if (vVar3 - null < 0xc) {
    local_b8[0]._0_4_ = *(value *)(&DAT_0011edac + (ulong)(vVar3 - null) * 4);
  }
  local_c0 = CONCAT44(local_c0._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b5,"void number_suite::value_uint16()",local_b8,&local_c0);
  trial::protocol::bintoken::reader::overloader<unsigned_char,_void>::convert(&local_98);
  boost::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b7,"void number_suite::value_uint16()");
  uVar2 = trial::protocol::bintoken::reader::overloader<unsigned_short,_void>::convert(&local_98);
  local_c0 = CONCAT62(local_c0._2_6_,uVar2);
  local_b8[0]._0_4_ = 0xffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0xFFFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b8,"void number_suite::value_uint16()",&local_c0,local_b8);
  uVar4 = trial::protocol::bintoken::reader::overloader<unsigned_int,_void>::convert(&local_98);
  local_b8[0] = CONCAT44(local_b8[0]._4_4_,uVar4);
  local_c0 = CONCAT44(local_c0._4_4_,0xffff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x0000FFFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b9,"void number_suite::value_uint16()",local_b8,&local_c0);
  bVar1 = trial::protocol::bintoken::reader::next(&local_98);
  local_b8[0] = CONCAT71(local_b8[0]._1_7_,bVar1);
  local_c0 = local_c0 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ba,"void number_suite::value_uint16()",local_b8,&local_c0);
  local_b8[0] = CONCAT44(local_b8[0]._4_4_,local_98.decoder.current.code);
  local_c0 = local_c0 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1bb,"void number_suite::value_uint16()",local_b8,&local_c0);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_98.stack);
  return;
}

Assistant:

void value_uint16()
{
    const value_type input[] = {
        token::code::int16, 0xFF, 0x7F,
        token::code::int16, 0x00, 0x80,
        token::code::int16, 0xFF, 0xFF
    };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0x7FFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x00007FFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint64_t>(), UINT64_C(0x0000000000007FFF));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0x8000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x00008000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0xFFFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x0000FFFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}